

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::iterate(PointSizeCase *this)

{
  ChannelType CVar1;
  ostringstream *poVar2;
  uint uVar3;
  RenderContext *context;
  TestLog *pTVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  ulong uVar12;
  TestError *this_00;
  ConstPixelBufferAccess *access;
  int iVar13;
  void *__buf;
  ulong uVar14;
  PointSizeCase *pPVar15;
  qpTestResult testResult;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  ChannelType CVar19;
  ChannelType CVar20;
  ChannelType CVar21;
  ChannelType CVar22;
  allocator<char> local_24e;
  allocator<char> local_24d;
  int local_24c;
  PointSizeCase *local_248;
  IVec2 pointSize;
  VertexArray vao;
  Surface resultImage;
  string local_1d0;
  undefined1 local_1b0 [384];
  long lVar10;
  
  tcu::Surface::Surface(&resultImage,0x20,0x20);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  uVar3 = this->m_flags;
  iVar7 = (**(code **)(lVar10 + 0x780))((this->m_program->m_program).m_program,"a_position");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Rendering single point.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  if (iVar7 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Attribute a_position location was -1",
               (allocator<char> *)&pointSize);
    tcu::TestError::TestError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar10 + 0x1a00))(0,0,0x20);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x734);
  (**(code **)(lVar10 + 0xd8))(vao.super_ObjectWrapper.m_object);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x737);
  (**(code **)(lVar10 + 0x1680))((this->m_program->m_program).m_program);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x73a);
  (**(code **)(lVar10 + 0x1858))(0,0,0,0x3f800000,iVar7);
  if ((uVar3 & 0x1e) == 0) {
    (**(code **)(lVar10 + 0x538))(0,0,1);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    iVar7 = 0x749;
    pcVar16 = "draw points";
  }
  else {
    (**(code **)(lVar10 + 0xfd8))(0x8e72,1);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x741);
    (**(code **)(lVar10 + 0x538))(0xe,0,1);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    iVar7 = 0x744;
    pcVar16 = "draw patches";
  }
  glu::checkError(dVar8,pcVar16,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,iVar7);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&resultImage);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar11->m_numSamples;
  iVar9 = getExpectedPointSize(this);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Verifying rendered point size. Expecting ");
  std::ostream::operator<<(poVar2,iVar9);
  std::operator<<((ostream *)poVar2," pixels.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&pointSize,"RenderImage",&local_24d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Rendered image",&local_24e);
  tcu::Surface::getAccess((ConstPixelBufferAccess *)&vao,&resultImage);
  access = (ConstPixelBufferAccess *)&vao;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)&pointSize,&local_1d0,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  local_24c = iVar9;
  local_248 = this;
  tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar4,__buf,(size_t)access);
  tcu::LogImage::~LogImage((LogImage *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&pointSize);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&vao);
  pPVar15 = local_248;
  uVar14 = (ulong)(uint)vao.super_ObjectWrapper.m_traits;
  iVar9 = 0;
  uVar17 = 0;
  if (0 < resultImage.m_width) {
    uVar17 = (ulong)(uint)resultImage.m_width;
  }
  if (resultImage.m_height < 1) {
    resultImage.m_height = SNORM_INT8;
  }
  bVar6 = false;
  iVar13 = (int)vao.super_ObjectWrapper.m_gl;
  CVar19 = vao.super_ObjectWrapper.m_gl._4_4_;
  CVar21 = vao.super_ObjectWrapper.m_traits._4_4_;
  CVar22 = vao.super_ObjectWrapper.m_gl._4_4_;
  iVar18 = (int)vao.super_ObjectWrapper.m_gl;
  CVar20 = SNORM_INT8;
  while (CVar20 != resultImage.m_height) {
    CVar1 = CVar20 + SNORM_INT16;
    uVar12 = 0;
    while (uVar17 != uVar12) {
      iVar5 = (int)uVar12;
      if ((*(uint *)((long)resultImage.m_pixels.m_ptr + (long)(iVar9 + iVar5) * 4) & 0xffffff) == 0)
      {
        uVar12 = uVar12 + 1;
      }
      else if (bVar6) {
        if (iVar5 <= iVar18) {
          iVar18 = iVar5;
        }
        if ((int)CVar20 <= (int)CVar22) {
          CVar22 = CVar20;
        }
        uVar12 = uVar12 + 1;
        if ((int)uVar14 <= (int)uVar12) {
          uVar14 = uVar12;
        }
        if ((int)CVar21 <= (int)CVar1) {
          CVar21 = CVar1;
        }
        vao.super_ObjectWrapper.m_traits._0_4_ = (uint)uVar14;
        uVar14 = uVar14 & 0xffffffff;
        iVar13 = iVar18;
        CVar19 = CVar22;
        vao.super_ObjectWrapper.m_gl._0_4_ = iVar18;
        vao.super_ObjectWrapper.m_gl._4_4_ = CVar22;
        vao.super_ObjectWrapper.m_traits._4_4_ = CVar21;
      }
      else {
        uVar12 = uVar12 + 1;
        vao.super_ObjectWrapper.m_traits._0_4_ = (uint)uVar12;
        bVar6 = true;
        uVar14 = uVar12;
        iVar13 = iVar5;
        CVar19 = CVar20;
        CVar21 = CVar1;
        CVar22 = CVar20;
        iVar18 = iVar5;
        vao.super_ObjectWrapper.m_gl._0_4_ = iVar5;
        vao.super_ObjectWrapper.m_gl._4_4_ = CVar20;
        vao.super_ObjectWrapper.m_traits._4_4_ = CVar1;
      }
    }
    iVar9 = iVar9 + resultImage.m_width;
    CVar20 = CVar1;
  }
  if (bVar6) {
    local_1d0._M_dataplus._M_p._0_4_ = iVar13;
    local_1d0._M_dataplus._M_p._4_4_ = CVar19;
    if (iVar7 < 2) {
      local_1b0._4_4_ = CVar21;
      local_1b0._0_4_ = (ChannelOrder)uVar14;
      tcu::operator-((Vector<int,_2> *)local_1b0,(Vector<int,_2> *)&local_1d0);
      pPVar15 = local_248;
      iVar7 = local_24c;
      if (pointSize.m_data[0] == pointSize.m_data[1]) {
        if (pointSize.m_data[0] == local_24c) goto LAB_0131f5c1;
        local_1b0._0_8_ =
             ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR! Point size invalid, expected ");
        std::ostream::operator<<(poVar2,iVar7);
        std::operator<<((ostream *)poVar2,", got ");
        std::ostream::operator<<(poVar2,pointSize.m_data[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ =
             ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR! Rasterized point is not a square. Point size was "
                       );
        tcu::operator<<((ostream *)poVar2,&pointSize);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1b0._4_4_ = CVar21;
      local_1b0._0_4_ = (ChannelOrder)uVar14;
      tcu::operator-((Vector<int,_2> *)local_1b0,(Vector<int,_2> *)&local_1d0);
      pPVar15 = local_248;
      iVar9 = local_24c;
      iVar13 = pointSize.m_data[0] - pointSize.m_data[1];
      iVar7 = -iVar13;
      if (0 < iVar13) {
        iVar7 = iVar13;
      }
      if (iVar7 < 2) {
        iVar7 = pointSize.m_data[1];
        if (pointSize.m_data[1] < pointSize.m_data[0]) {
          iVar7 = pointSize.m_data[0];
        }
        if (local_24c + 1 == iVar7 || local_24c == iVar7) {
LAB_0131f5c1:
          pcVar16 = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          pPVar15 = local_248;
          goto LAB_0131f4d5;
        }
        local_1b0._0_8_ =
             ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR! Point size invalid, expected ");
        std::ostream::operator<<(poVar2,iVar9);
        std::operator<<((ostream *)poVar2,", got ");
        if (pointSize.m_data[1] < pointSize.m_data[0]) {
          pointSize.m_data[1] = pointSize.m_data[0];
        }
        std::ostream::operator<<(poVar2,pointSize.m_data[1]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ =
             ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "ERROR! Rasterized point is not a square. Detected point size was ");
        tcu::operator<<((ostream *)poVar2,&pointSize);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
  }
  else {
    local_1b0._0_8_ = ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "Verification failed, could not find any point fragments.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  pcVar16 = "Image verification failed";
  testResult = QP_TEST_RESULT_FAIL;
LAB_0131f4d5:
  tcu::TestContext::setTestResult
            ((pPVar15->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar16);
  tcu::Surface::~Surface(&resultImage);
  return STOP;
}

Assistant:

PointSizeCase::IterateResult PointSizeCase::iterate (void)
{
	tcu::Surface resultImage(RENDER_SIZE, RENDER_SIZE);

	renderTo(resultImage);

	if (verifyImage(resultImage))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}